

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O2

SPIRConstant * __thiscall
diligent_spirv_cross::Parser::
set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int_const*,unsigned_int,bool>
          (Parser *this,uint32_t id,uint *args,uint **args_1,uint *args_2,bool *args_3)

{
  SPIRConstant *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeConstant,(ID)id);
  pSVar1 = variant_set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int_const*,unsigned_int,bool>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id,args,
                      args_1,args_2,args_3);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}